

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bfile.c
# Opt level: O2

uint16_t bf_peek_uint16_be(bfile_t *bfile)

{
  uint16_t uVar1;
  ulong uVar2;
  int iVar3;
  
  uVar2 = bfile->pos;
  if ((uVar2 % (ulong)bfile->buffer_size == 0) && (uVar2 == bfile->ipos)) {
    bf_read_buffer(bfile);
    uVar2 = bfile->pos;
  }
  if (bfile->ipos - 2 < uVar2) {
    fwrite("bfile warning: could not peek on next uint16.\n",0x2e,1,_stderr);
    uVar1 = 0;
  }
  else {
    iVar3 = (int)(uVar2 % (ulong)bfile->buffer_size);
    uVar1 = CONCAT11(bfile->buffer[iVar3],bfile->buffer[(int)((iVar3 + 1U) % bfile->buffer_size)]);
  }
  return uVar1;
}

Assistant:

uint16_t
bf_peek_uint16_be(
    bfile_t * bfile )
{
    uint16_t value;
    int bufoff;

    assert( bfile != NULL );
    assert( (bfile->flags & BF_READABLE) != FALSE );

    bufoff = bfile->pos % bfile->buffer_size;
    if ( (bufoff == 0) && (bfile->pos == bfile->ipos) )
        bf_read_buffer( bfile );

    if ( bfile->pos > (bfile->ipos - 2) ) {
        fprintf( stderr,
            "bfile warning: could not peek on next uint16.\n" );
        return 0;
    }

    bufoff = bfile->pos % bfile->buffer_size;
    value = bfile->buffer[bufoff] << 8;
    bufoff = (bufoff + 1) % bfile->buffer_size;
    value = value | bfile->buffer[bufoff];

    return value;
}